

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O3

int ready_weapon(obj *wep)

{
  short sVar1;
  uint uVar2;
  level *lev;
  obj *poVar3;
  boolean bVar4;
  char rmno;
  ushort uVar5;
  int iVar6;
  char *pcVar7;
  monst *mtmp;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char kbuf [256];
  char acStack_138 [264];
  
  poVar3 = uwep;
  if (wep == (obj *)0x0) {
    pcVar8 = body_part(7);
    if (poVar3 != (obj *)0x0) {
      pline("You are empty %s.",pcVar8);
      setuwep((obj *)0x0);
      return 1;
    }
    pcVar9 = "You are already empty %s.";
LAB_00287cf2:
    pline(pcVar9,pcVar8);
    return 0;
  }
  if (((((uarmg == (obj *)0x0) && (u.uprops[8].extrinsic == 0)) &&
       (((byte)youmonst.mintrinsics & 0x80) == 0)) &&
      ((wep->otyp == 0x10e && (wep->corpsenm - 0xbU < 2)))) &&
     ((bVar4 = poly_when_stoned(youmonst.data), bVar4 == '\0' ||
      (iVar6 = polymon(0x108), iVar6 == 0)))) {
    pcVar8 = mons_mname(mons + wep->corpsenm);
    pcVar9 = body_part(6);
    pcVar9 = makeplural(pcVar9);
    pline("You wield the %s corpse in your bare %s.",pcVar8,pcVar9);
    pcVar8 = mons_mname(mons + wep->corpsenm);
    pcVar8 = an(pcVar8);
    sprintf(acStack_138,"%s corpse",pcVar8);
    bVar4 = delayed_petrify((char *)0x0,acStack_138);
    if (bVar4 != '\0') {
      pcVar8 = mons_mname(mons + wep->corpsenm);
      pline("You release the %s corpse!",pcVar8);
      return 1;
    }
    return 0;
  }
  if ((uarms != (obj *)0x0) && ((byte)(wep->oclass | 4U) == 6)) {
    sVar1 = wep->otyp;
    if ((objects[sVar1].field_0x11 & 1) != 0) {
      if ((wep->oclass == 2) && ((byte)(objects[sVar1].oc_subtyp - 5U) < 6)) {
        pcVar8 = "sword";
      }
      else {
        pcVar8 = "weapon";
        if (sVar1 == 0x1c) {
          pcVar8 = "axe";
        }
      }
      pcVar9 = "You cannot wield a two-handed %s while wearing a shield.";
      goto LAB_00287cf2;
    }
  }
  if ((wep->oartifact != '\0') && (iVar6 = touch_artifact(wep,&youmonst), iVar6 == 0)) {
    return 1;
  }
  if ((wep->field_0x4a & 1) == 0) {
LAB_00287c1b:
    uVar2 = wep->owornmask;
    wep->owornmask = uVar2 | 0x100;
    prinv((char *)0x0,wep,0);
    wep->owornmask = uVar2;
  }
  else {
    if (wep->oclass != '\x02') {
      if (wep->oclass == '\x06') {
        uVar5 = wep->otyp;
        if (objects[(short)uVar5].oc_subtyp != '\0') goto LAB_00287d1b;
      }
      else {
        uVar5 = wep->otyp;
      }
      if ((1 < uVar5 - 0x216) && (uVar5 != 0xf4)) goto LAB_00287c1b;
    }
LAB_00287d1b:
    pcVar8 = xname(wep);
    pcVar9 = "The ";
    iVar6 = strncmp(pcVar8,"The ",4);
    if (iVar6 == 0) {
LAB_00287d5d:
      pcVar9 = "";
    }
    else {
      pcVar8 = The(pcVar8);
      iVar6 = strncmp(pcVar8,"The ",4);
      if (iVar6 != 0) goto LAB_00287d5d;
    }
    pcVar8 = aobjnam(wep,"weld");
    pcVar10 = "themselves";
    if (wep->quan == 1) {
      pcVar10 = "itself";
    }
    if (((byte)(wep->oclass | 4U) == 6) && ((objects[wep->otyp].field_0x11 & 1) != 0)) {
      pcVar7 = body_part(6);
      pcVar7 = makeplural(pcVar7);
    }
    else {
      pcVar7 = body_part(6);
    }
    pline("%s%s %s to your %s!",pcVar9,pcVar8,pcVar10,pcVar7);
    wep->field_0x4a = wep->field_0x4a | 0x40;
  }
  setuwep(wep);
  arti_speak(wep);
  bVar4 = artifact_light(wep);
  if ((bVar4 == '\0') || ((wep->field_0x4c & 8) != 0)) goto LAB_00287e83;
  begin_burn(level,wep,'\0');
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00287e3d;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00287e38;
  }
  else {
LAB_00287e38:
    if (ublindf == (obj *)0x0) goto LAB_00287e83;
LAB_00287e3d:
    if (ublindf->oartifact != '\x1d') goto LAB_00287e83;
  }
  pcVar8 = Tobjnam(wep,"begin");
  pline("%s to glow brilliantly!",pcVar8);
LAB_00287e83:
  lev = level;
  if ((wep->field_0x4a & 4) == 0) {
    return 1;
  }
  rmno = inside_shop(level,u.ux,u.uy);
  mtmp = shop_keeper(lev,rmno);
  if (mtmp != (monst *)0x0) {
    pcVar8 = shkname(mtmp);
    pcVar9 = xname(wep);
    pline("%s says \"You be careful with my %s!\"",pcVar8,pcVar9);
    return 1;
  }
  return 1;
}

Assistant:

static int ready_weapon(struct obj *wep)
{
	/* Separated function so swapping works easily */
	int res = 0;

	if (!wep) {
	    /* No weapon */
	    if (uwep) {
		pline("You are empty %s.", body_part(HANDED));
		setuwep(NULL);
		res++;
	    } else
		pline("You are already empty %s.", body_part(HANDED));
	} else if (!uarmg && !Stone_resistance && wep->otyp == CORPSE &&
		   touch_petrifies(&mons[wep->corpsenm]) &&
		   !(poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))) {
	    /* Prevent wielding cockatrice when not wearing gloves --KAA */
	    char kbuf[BUFSZ];

	    pline("You wield the %s corpse in your bare %s.",
		mons_mname(&mons[wep->corpsenm]), makeplural(body_part(HAND)));
	    sprintf(kbuf, "%s corpse", an(mons_mname(&mons[wep->corpsenm])));
	    if (delayed_petrify(NULL, kbuf)) {
		pline("You release the %s corpse!", mons_mname(&mons[wep->corpsenm]));
		res++;
	    }
	} else if (uarms && bimanual(wep))
	    pline("You cannot wield a two-handed %s while wearing a shield.",
		is_sword(wep) ? "sword" :
		    wep->otyp == BATTLE_AXE ? "axe" : "weapon");
	else if (wep->oartifact && !touch_artifact(wep, &youmonst)) {
	    res++;	/* takes a turn even though it doesn't get wielded */
	} else {
	    /* Weapon WILL be wielded after this point */
	    res++;
	    if (will_weld(wep)) {
		const char *tmp = xname(wep), *thestr = "The ";
		if (strncmp(tmp, thestr, 4) && !strncmp(The(tmp),thestr,4))
		    tmp = thestr;
		else tmp = "";
		pline("%s%s %s to your %s!", tmp, aobjnam(wep, "weld"),
			(wep->quan == 1L) ? "itself" : "themselves", /* a3 */
			bimanual(wep) ?
				(const char *)makeplural(body_part(HAND))
				: body_part(HAND));
		wep->bknown = TRUE;
	    } else {
		/* The message must be printed before setuwep (since
		 * you might die and be revived from changing weapons),
		 * and the message must be before the death message and
		 * Lifesaved rewielding.  Yet we want the message to
		 * say "weapon in hand", thus this kludge.
		 */
		long dummy = wep->owornmask;
		wep->owornmask |= W_WEP;
		prinv(NULL, wep, 0L);
		wep->owornmask = dummy;
	    }
	    setuwep(wep);

	    /* KMH -- Talking artifacts are finally implemented */
	    arti_speak(wep);

	    if (artifact_light(wep) && !wep->lamplit) {
		begin_burn(level, wep, FALSE);
		if (!Blind)
		    pline("%s to glow brilliantly!", Tobjnam(wep, "begin"));
	    }

	    if (wep->unpaid) {
		struct monst *this_shkp;

		if ((this_shkp = shop_keeper(level, inside_shop(level, u.ux, u.uy))) !=
		    NULL) {
		    pline("%s says \"You be careful with my %s!\"",
			  shkname(this_shkp),
			  xname(wep));
		}
	    }
	}
	return res;
}